

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O2

CATNNode<unsigned_char> *
std::__uninitialized_copy<false>::
__uninit_copy<Centaurus::CATNNode<unsigned_char>const*,Centaurus::CATNNode<unsigned_char>*>
          (CATNNode<unsigned_char> *__first,CATNNode<unsigned_char> *__last,
          CATNNode<unsigned_char> *__result)

{
  for (; __first != __last; __first = __first + 1) {
    Centaurus::CATNNode<unsigned_char>::CATNNode(__result,__first);
    __result = __result + 1;
  }
  return __result;
}

Assistant:

CharClass(wchar_t start, wchar_t end)
    {
        m_ranges.push_back(Range<TCHAR>::make_from_wide(start, end));
    }